

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O3

ArchKind __thiscall llvm::AArch64::parseCPUArch(AArch64 *this,StringRef CPU)

{
  int iVar1;
  char *__n;
  long lVar2;
  
  __n = CPU.Data;
  lVar2 = 0x10;
  while ((*(char **)((long)&PTR_anon_var_dwarf_261d5e_0023acc8 + lVar2) != __n ||
         ((__n != (char *)0x0 &&
          (iVar1 = bcmp(this,*(void **)((long)&PTR_anon_var_dwarf_254c0f_0023acc0 + lVar2),
                        (size_t)__n), iVar1 != 0))))) {
    lVar2 = lVar2 + 0x20;
    if (lVar2 == 0x2b0) {
      return INVALID;
    }
  }
  return *(ArchKind *)((long)&(anonymous_namespace)::AArch64CPUNames + lVar2);
}

Assistant:

AArch64::ArchKind llvm::AArch64::parseCPUArch(StringRef CPU) {
  for (const auto C : AArch64CPUNames) {
    if (CPU == C.getName())
      return C.ArchID;
  }
  return ArchKind::INVALID;
}